

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.c
# Opt level: O1

_Bool cfg_parse_simple_object(json_value *value,config_item *items)

{
  uint uVar1;
  json_value *value_00;
  int *piVar2;
  json_value *value_01;
  bool bVar3;
  char **ppcVar4;
  _Bool _Var5;
  config_item *item;
  void *pvVar6;
  config_item *pcVar7;
  char *pcVar8;
  config_item *pcVar9;
  int iVar10;
  int priority;
  char *pcVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  
  if ((value == (json_value *)0x0) || (value->type != json_object)) {
    _Var5 = false;
  }
  else {
    iVar10 = (value->u).boolean;
    _Var5 = true;
    if (0 < (long)iVar10) {
      lVar12 = 0;
      do {
        pcVar11 = (value->u).string.ptr;
        pcVar8 = *(char **)(pcVar11 + lVar12 * 0x18);
        item = cfg_find_item(pcVar8,items);
        if (item == (config_item *)0x0) {
          pcVar11 = "Unrecognized attribute: %s";
          iVar10 = 0x1a8;
          goto LAB_00105a5f;
        }
        value_00 = *(json_value **)(pcVar11 + lVar12 * 0x18 + 0x10);
        if (value_00 == (json_value *)0x0) {
          pcVar11 = "NULL pointers passed in!";
          iVar10 = 0x164;
LAB_00105a2d:
          pcVar8 = "save_object_value";
          priority = 7;
          goto LAB_00105a35;
        }
        _Var5 = is_same_type(value_00,item);
        if (!_Var5) {
          pcVar11 = "Type mismatch: %s";
          iVar10 = 0x168;
          goto LAB_00105a2d;
        }
        switch(value_00->type) {
        case json_object:
          if (item->subitems != (config_item *)0x0) {
            _Var5 = cfg_parse_simple_object(value_00,item->subitems);
LAB_00105772:
            if (_Var5 == false) goto LAB_00105a3c;
          }
          break;
        case json_array:
          if (item->list == false) goto LAB_00105a3c;
          uVar1 = (value_00->u).boolean;
          uVar13 = (ulong)(int)uVar1;
          if (uVar13 == 0) {
            item->vcount = 0;
            break;
          }
          uVar15 = (ulong)item->type;
          switch(item->type) {
          case cdt_bool:
            break;
          case cdt_uint16:
            uVar15 = 2;
            break;
          case cdt_int:
            uVar15 = 4;
            break;
          case cdt_double:
          case cdt_string:
            uVar15 = 8;
            break;
          case cdt_object:
            if (item->subitems_init_cb == (_func_config_item_t_ptr_uint *)0x0) {
              pcVar8 = "save_list_values";
              pcVar11 = "Object array has no init callback associated: %s";
              iVar10 = 0xfe;
              goto LAB_00105b41;
            }
            pcVar7 = (*item->subitems_init_cb)(uVar1);
            if (pcVar7 != (config_item_t *)0x0) {
              item->subitems = pcVar7;
              item->vcount = uVar1;
              if (0 < (int)uVar1) {
                uVar15 = 0;
LAB_0010597c:
                _Var5 = cfg_parse_simple_object
                                  (*(json_value **)((value_00->u).string.ptr + uVar15 * 8),pcVar7);
                if (_Var5) goto code_r0x00105994;
                _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cfg.c"
                           ,0x108,"save_list_values",0,7,"Failed to handle object array: %s",
                           pcVar7->key);
                pcVar7 = item->subitems;
                do {
                  cfg_reset_items(pcVar7);
                  pcVar9 = pcVar7;
                  if (pcVar7 == (config_item *)0x0) {
                    pcVar7 = (config_item *)0x0;
                  }
                  else {
                    do {
                      pcVar7 = pcVar9 + 1;
                      ppcVar4 = &pcVar9->key;
                      pcVar9 = pcVar7;
                    } while (*ppcVar4 != (char *)0x0);
                  }
                  iVar10 = (int)uVar15;
                  uVar15 = (ulong)(iVar10 - 1);
                } while (0 < iVar10);
                if (item->subitems_free_cb != (_func_void_config_item_t_ptr_uint *)0x0) {
                  (*item->subitems_free_cb)(item->subitems,uVar1);
                }
                item->subitems = (config_item_t *)0x0;
                item->vcount = 0;
                goto LAB_00105a3c;
              }
              goto LAB_00105936;
            }
            goto LAB_00105a3c;
          default:
            pcVar8 = "save_list_values";
            pcVar11 = "Config item of type %d is not supported!";
            iVar10 = 0x12d;
            goto LAB_00105b41;
          }
          pvVar6 = malloc(uVar15 * uVar13);
          item->value = pvVar6;
          item->_malloc = pvVar6;
          if (pvVar6 == (void *)0x0) {
            pcVar8 = "save_list_values";
            pcVar11 = "Out of memory!";
            iVar10 = 0x133;
LAB_00105b41:
            priority = 3;
LAB_00105a35:
            _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cfg.c",
                       iVar10,pcVar8,0,priority,pcVar11);
            goto LAB_00105a3c;
          }
          if ((int)uVar1 < 1) {
            _Var5 = true;
            uVar15 = 0;
          }
          else {
            uVar15 = 0;
            while( true ) {
              value_01 = *(json_value **)((value_00->u).string.ptr + uVar15 * 8);
              _Var5 = is_same_type(value_01,item);
              if (!_Var5) break;
              switch(item->type) {
              case cdt_bool:
                *(bool *)((long)item->value + uVar15) = (value_01->u).boolean != 0;
                break;
              case cdt_uint16:
                *(undefined2 *)((long)item->value + uVar15 * 2) = *(undefined2 *)&value_01->u;
                break;
              case cdt_int:
                *(int *)((long)item->value + uVar15 * 4) = (value_01->u).boolean;
                break;
              case cdt_double:
                *(int64_t *)((long)item->value + uVar15 * 8) = (value_01->u).integer;
                break;
              case cdt_string:
                pcVar11 = acopy_string((char **)(uVar15 * 8 + (long)item->value),value_01);
                if (pcVar11 == (char *)0x0) {
                  _Var5 = false;
                }
                break;
              default:
                _Var5 = false;
              }
              uVar15 = uVar15 + 1;
              if ((uVar13 <= uVar15) || (_Var5 == false)) break;
            }
            uVar15 = uVar15 & 0xffffffff;
          }
          if (_Var5 == false) {
            if (item->type == cdt_string) {
              lVar12 = uVar15 + 1;
              do {
                pvVar6 = *(void **)((long)item->value + lVar12 * 8 + -8);
                if (pvVar6 != (void *)0x0) {
                  free(pvVar6);
                }
                lVar14 = lVar12 + -1;
                bVar3 = 0 < lVar12;
                lVar12 = lVar14;
              } while (lVar14 != 0 && bVar3);
            }
            free(item->_malloc);
            item->value = (void *)0x0;
            item->_malloc = (void *)0x0;
LAB_00105a3c:
            pcVar8 = item->key;
            pcVar11 = "Failed to parse attributes in: %s";
            iVar10 = 0x1a3;
LAB_00105a5f:
            _log_write("/workspace/llm4binary/github/license_c_cmakelists/semigodking[P]cdns/cfg.c",
                       iVar10,"cfg_parse_simple_object",0,3,pcVar11,pcVar8);
            return false;
          }
          item->vcount = uVar1;
          break;
        case json_integer:
          piVar2 = (int *)item->value;
          if (item->type == cdt_uint16) {
            if (piVar2 != (int *)0x0) {
              *(undefined2 *)piVar2 = *(undefined2 *)&value_00->u;
            }
          }
          else if (piVar2 != (int *)0x0) {
            *piVar2 = (value_00->u).boolean;
          }
          break;
        case json_double:
          if ((int64_t *)item->value != (int64_t *)0x0) {
            *(int64_t *)item->value = (value_00->u).integer;
          }
          break;
        case json_string:
          if ((char **)item->value != (char **)0x0) {
            pcVar11 = acopy_string((char **)item->value,value_00);
            item->_malloc = pcVar11;
            _Var5 = pcVar11 != (char *)0x0;
            goto LAB_00105772;
          }
          break;
        case json_boolean:
          if (item->value != (void *)0x0) {
            *(bool *)item->value = (value_00->u).boolean != 0;
          }
          break;
        default:
          pcVar8 = "save_object_value";
          pcVar11 = "Type %d of JSON is not supported!";
          iVar10 = 0x18c;
          goto LAB_00105b41;
        }
LAB_00105936:
        lVar12 = lVar12 + 1;
      } while (lVar12 != iVar10);
      _Var5 = true;
    }
  }
  return _Var5;
code_r0x00105994:
  pcVar9 = pcVar7;
  if (pcVar7 == (config_item *)0x0) {
    pcVar7 = (config_item *)0x0;
  }
  else {
    do {
      pcVar7 = pcVar9 + 1;
      ppcVar4 = &pcVar9->key;
      pcVar9 = pcVar7;
    } while (*ppcVar4 != (char *)0x0);
  }
  uVar15 = uVar15 + 1;
  if (uVar15 == uVar13) goto LAB_00105936;
  goto LAB_0010597c;
}

Assistant:

bool cfg_parse_simple_object(json_value * value, config_item * items)
{
    int i, n;
    config_item * item;
    json_object_entry * obj;
   
    // accept object only
    if (value == NULL || value->type != json_object)
        return false;

    n = value->u.object.length;
    for (i = 0; i < n; i ++) {
        obj = value->u.object.values + i;
        item = cfg_find_item(obj->name, items);
        if (item) {
            if (!save_object_value(obj->value, item)) {
                // Invalid value type
                log_error(LOG_ERR, "Failed to parse attributes in: %s", item->key);
                return false;
            }
        }
        else {
            log_error(LOG_ERR, "Unrecognized attribute: %s", obj->name);
            return false;
        }
    }
    return true;
}